

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void VP8YuvToRgb56532_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  __m128i *in_RCX;
  __m128i *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  __m128i B;
  __m128i G;
  __m128i R;
  int n;
  uint8_t *in_stack_ffffffffffffffc0;
  __m128i *in_stack_ffffffffffffffc8;
  __m128i *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 0x20; iVar1 = iVar1 + 8) {
    YUV444ToRGB_SSE2((uint8_t *)B[0],in_RDI,in_RSI,in_RDX,in_RCX,
                     (__m128i *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    PackAndStore565_SSE2
              ((__m128i *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    in_RCX = in_RCX + 1;
  }
  return;
}

Assistant:

void VP8YuvToRgb56532_SSE2(const uint8_t* y, const uint8_t* u, const uint8_t* v,
                           uint8_t* dst) {
  int n;
  for (n = 0; n < 32; n += 8, dst += 16) {
    __m128i R, G, B;
    YUV444ToRGB_SSE2(y + n, u + n, v + n, &R, &G, &B);
    PackAndStore565_SSE2(&R, &G, &B, dst);
  }
}